

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Plan.cpp
# Opt level: O2

void __thiscall
imrt::Plan::Plan(Plan *this,vector<double,_std::allocator<double>_> *w,
                vector<double,_std::allocator<double>_> *Zmin,
                vector<double,_std::allocator<double>_> *Zmax,Collimator *collimator,
                vector<imrt::Volume,_std::allocator<imrt::Volume>_> *volumes,int max_apertures,
                int max_intensity,int initial_intensity,int step_intensity,int open_apertures,
                int setup,char *file)

{
  _Rb_tree_header *p_Var1;
  int iVar2;
  EvaluationFunction *pEVar3;
  ostream *poVar4;
  fstream *this_00;
  Station *this_01;
  mapped_type *ppSVar5;
  int i;
  int local_3c;
  map<int,_imrt::Station_*,_std::less<int>,_std::allocator<std::pair<const_int,_imrt::Station_*>_>_>
  *local_38;
  
  this->_vptr_Plan = (_func_int **)&PTR__Plan_001399c0;
  p_Var1 = &(this->angle2station)._M_t._M_impl.super__Rb_tree_header;
  (this->angle2station)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->angle2station)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->angle2station)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (this->angle2station)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  (this->angle2station)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  (this->stations).super__List_base<imrt::Station_*,_std::allocator<imrt::Station_*>_>._M_impl.
  _M_node.super__List_node_base._M_prev = (_List_node_base *)&this->stations;
  (this->stations).super__List_base<imrt::Station_*,_std::allocator<imrt::Station_*>_>._M_impl.
  _M_node.super__List_node_base._M_next = (_List_node_base *)&this->stations;
  (this->stations).super__List_base<imrt::Station_*,_std::allocator<imrt::Station_*>_>._M_impl.
  _M_node._M_size = 0;
  local_38 = &this->angle2station;
  (this->last_diff).
  super__List_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>._M_impl._M_node
  .super__List_node_base._M_prev = (_List_node_base *)&this->last_diff;
  (this->last_diff).
  super__List_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>._M_impl._M_node
  .super__List_node_base._M_next = (_List_node_base *)&this->last_diff;
  (this->last_diff).
  super__List_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>._M_impl._M_node
  ._M_size = 0;
  pEVar3 = EvaluationFunction::getInstance(volumes,collimator);
  this->ev = pEVar3;
  std::vector<double,_std::allocator<double>_>::vector(&this->w,w);
  std::vector<double,_std::allocator<double>_>::vector(&this->Zmin,Zmin);
  std::vector<double,_std::allocator<double>_>::vector(&this->Zmax,Zmax);
  poVar4 = std::operator<<((ostream *)&std::cout,"##Initilizing plan.");
  std::endl<char,std::char_traits<char>>(poVar4);
  i = 0;
  if (file == (char *)0x0) {
    this_00 = (fstream *)0x0;
  }
  else {
    this_00 = (fstream *)operator_new(0x210);
    std::fstream::fstream(this_00,file,_S_in);
    i = 0;
  }
  while( true ) {
    iVar2 = Collimator::getNbAngles(collimator);
    if (iVar2 <= i) break;
    this_01 = (Station *)operator_new(0x170);
    iVar2 = Collimator::getAngle(collimator,i);
    Station::Station(this_01,collimator,volumes,iVar2,max_apertures,max_intensity,initial_intensity,
                     step_intensity,open_apertures,setup,(fstream *)this_00);
    add_station(this,this_01);
    local_3c = Collimator::getAngle(collimator,i);
    ppSVar5 = std::
              map<int,_imrt::Station_*,_std::less<int>,_std::allocator<std::pair<const_int,_imrt::Station_*>_>_>
              ::operator[](local_38,&local_3c);
    *ppSVar5 = this_01;
    i = i + 1;
  }
  if (this_00 != (fstream *)0x0) {
    std::fstream::close();
    (**(code **)(*(long *)this_00 + 8))(this_00);
  }
  poVar4 = std::operator<<((ostream *)&std::cout,"##  Created ");
  poVar4 = std::ostream::_M_insert<unsigned_long>((ulong)poVar4);
  poVar4 = std::operator<<(poVar4," stations.");
  std::endl<char,std::char_traits<char>>(poVar4);
  eval(this);
  std::operator<<((ostream *)&std::cout,"##  Initial evaluation: ");
  poVar4 = std::ostream::_M_insert<double>(this->evaluation_fx);
  poVar4 = std::operator<<(poVar4,".");
  std::endl<char,std::char_traits<char>>(poVar4);
  this->last_changed = (Station *)0x0;
  return;
}

Assistant:

Plan::Plan(vector<double> w, vector<double> Zmin, vector<double> Zmax, Collimator& collimator,
             vector<Volume>& volumes, int max_apertures, int max_intensity, int initial_intensity,
             int step_intensity, int open_apertures, int setup, char* file) :
             ev(EvaluationFunction::getInstance(volumes, collimator)), w(w), Zmin(Zmin), Zmax(Zmax) {

    cout << "##Initilizing plan."<< endl;


    fstream* myfile=NULL;
    if(file) myfile=new fstream(file, std::ios_base::in);

    for (int i=0;i<collimator.getNbAngles();i++) {
      Station* station = new Station(collimator, volumes, collimator.getAngle(i), max_apertures,
                                     max_intensity, initial_intensity, step_intensity, open_apertures, setup, myfile);
      add_station(*station);
      angle2station[collimator.getAngle(i)]=station;
    }
    if(myfile){
    	myfile->close();
        delete myfile;
    }
    cout << "##  Created " << stations.size() << " stations."<< endl;
    eval();
    cout << "##  Initial evaluation: " << evaluation_fx << "."<< endl;
    last_changed=NULL;

    //ev.create_beam2voxel_list(*this);
  }